

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Signal *this;
  Config *pCVar3;
  self *psVar4;
  char *str;
  LogStream *this_00;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  SourceFile file_07;
  SourceFile file_08;
  undefined1 local_1090 [12];
  undefined1 local_1080 [12];
  undefined1 local_1070 [12];
  undefined1 local_1060 [12];
  undefined1 local_1050 [12];
  undefined1 local_1040 [12];
  undefined1 local_1030 [12];
  undefined1 local_1020 [12];
  undefined1 local_1010 [12];
  undefined1 local_1000 [12];
  Logger local_ff0;
  
  g_stopEvent = 0;
  g_filep = (FILE *)fopen("../flyd_log","ae");
  if ((FILE *)g_filep == (FILE *)0x0) {
    puts(&DAT_00120184);
  }
  muduo::Logger::setOutput(dummyOutput);
  muduo::Logger::setFlush(dummyFlush);
  muduo::Logger::setLogLevel(DEBUG);
  this = flyd::Singleton<flyd::Signal>::getInstance();
  flyd::Signal::Init(this);
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  bVar1 = flyd::Config::Load(pCVar3,"../flyd.conf");
  if (!bVar1) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1000,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1000._0_8_;
    file.size_ = local_1000._8_4_;
    muduo::Logger::Logger(&local_ff0,file,0x43,FATAL);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,anon_var_dwarf_4a9);
    muduo::Logger::~Logger(&local_ff0);
  }
  CMemory::GetInstance();
  CCRC32::GetInstance();
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  iVar2 = flyd::Config::GetIntDefault(pCVar3,"ListenPort",0);
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1010,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_00._12_4_ = 0;
    file_00.data_ = (char *)local_1010._0_8_;
    file_00.size_ = local_1010._8_4_;
    muduo::Logger::Logger(&local_ff0,file_00,0x4e);
    psVar4 = muduo::LogStream::operator<<(&local_ff0.impl_.stream_,"port =");
    muduo::LogStream::operator<<(psVar4,iVar2);
    muduo::Logger::~Logger(&local_ff0);
  }
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  str = flyd::Config::GetString(pCVar3,"DBInfo");
  if (str == (char *)0x0) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1030,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_02._12_4_ = 0;
    file_02.data_ = (char *)local_1030._0_8_;
    file_02.size_ = local_1030._8_4_;
    muduo::Logger::Logger(&local_ff0,file_02,0x57,FATAL);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,"DBInfo get failed\n");
  }
  else {
    if (2 < muduo::g_logLevel) goto LAB_00114e55;
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1020,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_01._12_4_ = 0;
    file_01.data_ = (char *)local_1020._0_8_;
    file_01.size_ = local_1020._8_4_;
    muduo::Logger::Logger(&local_ff0,file_01,0x53);
    psVar4 = muduo::LogStream::operator<<(&local_ff0.impl_.stream_,"DBInfo = ");
    muduo::LogStream::operator<<(psVar4,str);
  }
  muduo::Logger::~Logger(&local_ff0);
LAB_00114e55:
  flyd_pid = getpid();
  flyd_parent = getppid();
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1040,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_03._12_4_ = 0;
    file_03.data_ = (char *)local_1040._0_8_;
    file_03.size_ = local_1040._8_4_;
    muduo::Logger::Logger(&local_ff0,file_03,0x5c);
    psVar4 = muduo::LogStream::operator<<(&local_ff0.impl_.stream_,anon_var_dwarf_515);
    this_00 = muduo::LogStream::operator<<(psVar4,flyd_pid);
    psVar4 = muduo::LogStream::operator<<(this_00,"ppid = ");
    muduo::LogStream::operator<<(psVar4,flyd_parent);
    muduo::Logger::~Logger(&local_ff0);
  }
  bVar1 = CLogicSocket::Initialize(&g_socket);
  if (!bVar1) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1050,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_04._12_4_ = 0;
    file_04.data_ = (char *)local_1050._0_8_;
    file_04.size_ = local_1050._8_4_;
    muduo::Logger::Logger(&local_ff0,file_04,0x60,FATAL);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,"socket initialize failed ");
    muduo::Logger::~Logger(&local_ff0);
  }
  iVar2 = flyd::flyd_daemon();
  if (iVar2 == -1) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1060,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_06._12_4_ = 0;
    file_06.data_ = (char *)local_1060._0_8_;
    file_06.size_ = local_1060._8_4_;
    muduo::Logger::Logger(&local_ff0,file_06,0x66,ERROR);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,anon_var_dwarf_557);
    muduo::Logger::~Logger(&local_ff0);
  }
  else if (iVar2 == 1) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1070,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_05._12_4_ = 0;
    file_05.data_ = (char *)local_1070._0_8_;
    file_05.size_ = local_1070._8_4_;
    muduo::Logger::Logger(&local_ff0,file_05,0x69,WARN);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,anon_var_dwarf_56d);
    muduo::Logger::~Logger(&local_ff0);
    exit(0);
  }
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1080,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_07._12_4_ = 0;
    file_07.data_ = (char *)local_1080._0_8_;
    file_07.size_ = local_1080._8_4_;
    muduo::Logger::Logger(&local_ff0,file_07,0x6e);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,"master exit successfully \n ");
    muduo::Logger::~Logger(&local_ff0);
  }
  flyd::flyd_master_process_cycle();
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<93>
              ((SourceFile *)local_1090,
               (char (*) [93])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/app/main.cc"
              );
    file_08._12_4_ = 0;
    file_08.data_ = (char *)local_1090._0_8_;
    file_08.size_ = local_1090._8_4_;
    muduo::Logger::Logger(&local_ff0,file_08,0x72);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,"exit successfully \n ");
    muduo::Logger::~Logger(&local_ff0);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    //0表示不退出
    g_stopEvent = 0;

    g_filep = ::fopen("../flyd_log", "ae");
    if(!g_filep)
        printf("打开失败\n");
    muduo::Logger::setOutput(dummyOutput);
    muduo::Logger::setFlush(dummyFlush);
    muduo::Logger::setLogLevel(muduo::Logger::DEBUG);

    //初始化信号
    Singleton<Signal>::getInstance().Init();

     //读取配置文件
    if(!Singleton<Config>::getInstance().Load("../flyd.conf"))
    {
        LOG_FATAL<<"配置文件读取失败，退出！\n";
    }

    //内存单例类
    CMemory::GetInstance();

    //CRC校验算法单例类
    CCRC32::GetInstance();

    //得到监听端口号
    int port = Singleton<Config>::getInstance().GetIntDefault("ListenPort", 0);
    LOG_INFO << "port =" << port;
    //得到监听的地址
    const char *pDBInfo = Singleton<Config>::getInstance().GetString("DBInfo");
    if(pDBInfo != NULL)
    {
        LOG_INFO << "DBInfo = " << pDBInfo;
    }
    else
    {
        LOG_FATAL<<("DBInfo get failed\n");
    }

    flyd_pid = getpid();      //取得进程pid
    flyd_parent = getppid();     //取得父进程的id
    LOG_INFO << "主进程pid = "<< flyd_pid << "ppid = " << flyd_parent;

    if(!g_socket.Initialize())//初始化socket
    {
        LOG_FATAL << "socket initialize failed ";
    }


    int cdaemonresult = flyd_daemon();
    if(cdaemonresult == -1) //fork()失败
        LOG_ERROR << "cdaemonresult:master进程创建失败\n";
    if(cdaemonresult == 1)
    {
        LOG_WARN << "这是原始的父进程，退出\n";
      //  while(1);
        exit(0);
    }

    LOG_INFO << "master exit successfully \n " ;

    flyd_master_process_cycle();

    LOG_INFO << "exit successfully \n " ;

    return 0;
}